

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O1

int lys_set_disabled(lys_module *module)

{
  lys_node **pplVar1;
  byte *pbVar2;
  uint16_t *puVar3;
  ushort uVar4;
  uint uVar5;
  lys_module **pplVar6;
  lys_module *plVar7;
  lys_node *plVar8;
  int iVar9;
  ly_set *set;
  char *format;
  ulong uVar10;
  uint8_t uVar11;
  ly_ctx *ctx;
  ulong uVar12;
  lys_import *plVar13;
  char *pcVar14;
  long lVar15;
  
  if (module == (lys_module *)0x0) {
    format = "Invalid arguments (%s()).";
    pcVar14 = "lys_set_disabled";
    ctx = (ly_ctx *)0x0;
LAB_0010d967:
    ly_log(ctx,LY_LLERR,LY_EINVAL,format,pcVar14);
    iVar9 = 1;
  }
  else {
    iVar9 = 0;
    if ((*(ushort *)&module->field_0x40 & 0x40) == 0) {
      ctx = module->ctx;
      if ((ulong)ctx->internal_module_count != 0) {
        uVar10 = 0;
        do {
          if ((ctx->models).list[uVar10] == module) {
            pcVar14 = module->name;
            format = "Internal module \"%s\" cannot be disabled.";
            goto LAB_0010d967;
          }
          uVar10 = uVar10 + 1;
        } while (ctx->internal_module_count != uVar10);
      }
      *(ushort *)&module->field_0x40 = *(ushort *)&module->field_0x40 | 0x40;
      set = ly_set_new();
LAB_0010d7ac:
      ly_set_add(set,module,0);
LAB_0010d7b6:
      uVar5 = (ctx->models).used;
      if ((int)(uint)ctx->internal_module_count < (int)uVar5) {
        uVar10 = (ulong)ctx->internal_module_count;
        do {
          pplVar6 = (ctx->models).list;
          module = pplVar6[uVar10];
          uVar4 = *(ushort *)&module->field_0x40;
          if ((uVar4 & 0x40) == 0) {
            if ((ulong)module->imp_size != 0) {
              uVar12 = 0;
              do {
                if (set->number != 0) {
                  lVar15 = 0;
                  do {
                    if (module->imp[uVar12].module == (lys_module *)(set->set).s[lVar15]) {
                      *(ushort *)&module->field_0x40 = uVar4 | 0x40;
                      goto LAB_0010d7ac;
                    }
                    lVar15 = lVar15 + 1;
                  } while (set->number != (uint)lVar15);
                }
                uVar12 = uVar12 + 1;
              } while (uVar12 != module->imp_size);
            }
            if (-1 < (char)uVar4) {
              uVar12 = (ulong)ctx->internal_module_count;
              if ((int)(uint)ctx->internal_module_count < (int)uVar5) {
                do {
                  plVar7 = pplVar6[uVar12];
                  if (((plVar7->field_0x40 & 0x40) == 0) &&
                     (uVar11 = plVar7->imp_size, uVar11 != '\0')) {
                    plVar13 = plVar7->imp;
                    do {
                      if (plVar13->module == module) goto LAB_0010d882;
                      plVar13 = plVar13 + 1;
                      uVar11 = uVar11 + 0xff;
                    } while (uVar11 != '\0');
                  }
                  uVar12 = uVar12 + 1;
                } while (uVar12 != uVar5);
              }
              *(ushort *)&module->field_0x40 = uVar4 | 0x40;
              ly_set_add(set,module,0);
              if (module->imp_size != '\0') goto LAB_0010d7b6;
            }
          }
LAB_0010d882:
          uVar10 = uVar10 + 1;
          uVar5 = (ctx->models).used;
          if ((int)uVar5 <= (int)uVar10) break;
        } while( true );
      }
      if (set->number != 0) {
        uVar10 = 0;
        do {
          pplVar1 = &(set->set).s[uVar10]->parent;
          *(ushort *)pplVar1 = *(ushort *)pplVar1 & 0xffbf;
          uVar10 = uVar10 + 1;
        } while (uVar10 < set->number);
      }
      ctx_modules_undo_backlinks(ctx,set);
      for (uVar10 = (ulong)set->number; uVar10 != 0; uVar10 = uVar10 - 1) {
        lys_sub_module_remove_devs_augs((lys_module *)(set->set).s[uVar10 - 1]);
      }
      if (set->number != 0) {
        uVar10 = 0;
        do {
          plVar8 = (set->set).s[uVar10];
          *(ushort *)&plVar8->parent = *(ushort *)&plVar8->parent | 0x40;
          if (*(char *)((long)&plVar8->parent + 6) != '\0') {
            lVar15 = 0;
            uVar12 = 0;
            do {
              pbVar2 = (byte *)(*(long *)(*(long *)plVar8->hash + lVar15) + 0x40);
              *pbVar2 = *pbVar2 | 0x40;
              uVar12 = uVar12 + 1;
              lVar15 = lVar15 + 0x30;
            } while (uVar12 < *(byte *)((long)&plVar8->parent + 6));
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 < set->number);
      }
      ly_set_free(set);
      puVar3 = &(ctx->models).module_set_id;
      *puVar3 = *puVar3 + 1;
      iVar9 = 0;
    }
  }
  return iVar9;
}

Assistant:

API int
lys_set_disabled(const struct lys_module *module)
{
    struct ly_ctx *ctx; /* shortcut */
    struct lys_module *mod;
    struct ly_set *mods;
    uint8_t j, imported;
    int i, o;
    unsigned int u, v;

    if (!module) {
        LOGARG;
        return EXIT_FAILURE;
    } else if (module->disabled) {
        /* already disabled module */
        return EXIT_SUCCESS;
    }
    mod = (struct lys_module *)module;
    ctx = mod->ctx;

    /* avoid disabling internal modules */
    for (i = 0; i < ctx->internal_module_count; i++) {
        if (mod == ctx->models.list[i]) {
            LOGERR(ctx, LY_EINVAL, "Internal module \"%s\" cannot be disabled.", mod->name);
            return EXIT_FAILURE;
        }
    }

    /* disable the module */
    mod->disabled = 1;

    /* get the complete list of modules to disable because of dependencies,
     * we are going also to disable all the imported (not implemented) modules
     * that are not used in any other module */
    mods = ly_set_new();
    ly_set_add(mods, mod, 0);
checkdependency:
    for (i = ctx->internal_module_count; i < ctx->models.used; i++) {
        mod = ctx->models.list[i]; /* shortcut */
        if (mod->disabled) {
            /* skip the already disabled modules */
            continue;
        }

        /* check depndency of imported modules */
        for (j = 0; j < mod->imp_size; j++) {
            for (u = 0; u < mods->number; u++) {
                if (mod->imp[j].module == mods->set.g[u]) {
                    /* module is importing some module to disable, so it must be also disabled */
                    mod->disabled = 1;
                    ly_set_add(mods, mod, 0);
                    /* we have to start again because some of the already checked modules can
                     * depend on the one we have just decided to disable */
                    goto checkdependency;
                }
            }
        }
        /* check if the imported module is used in any module supposed to be kept */
        if (!mod->implemented) {
            imported = 0;
            for (o = ctx->internal_module_count; o < ctx->models.used; o++) {
                if (ctx->models.list[o]->disabled) {
                    /* skip modules already disabled */
                    continue;
                }
                for (j = 0; j < ctx->models.list[o]->imp_size; j++) {
                    if (ctx->models.list[o]->imp[j].module == mod) {
                        /* the module is used in some other module not yet selected to be disabled */
                        imported = 1;
                        goto imported;
                    }
                }
            }
imported:
            if (!imported) {
                /* module is not implemented and neither imported by any other module in context
                 * which is supposed to be kept enabled after this operation, so we are going to disable also
                 * this module */
                mod->disabled = 1;
                ly_set_add(mods, mod, 0);
                /* we have to start again, this time not because other module can depend on this one
                 * (we know that there is no such module), but because the module can import module
                 * that could became useless. If there are no imports, we can continue */
                if (mod->imp_size) {
                    goto checkdependency;
                }
            }
        }
    }

    /* before removing applied deviations, augments and updating leafrefs, we have to enable the modules
     * to disable to allow all that operations */
    for (u = 0; u < mods->number; u++) {
        ((struct lys_module *)mods->set.g[u])->disabled = 0;
    }

    /* maintain backlinks (start with internal ietf-yang-library which have leafs as possible targets of leafrefs */
    ctx_modules_undo_backlinks(ctx, mods);

    /* remove the applied deviations and augments */
    u = mods->number;
    while (u--) {
        lys_sub_module_remove_devs_augs((struct lys_module *)mods->set.g[u]);
    }

    /* now again disable the modules to disable and disable also all its submodules */
    for (u = 0; u < mods->number; u++) {
        mod = (struct lys_module *)mods->set.g[u];
        mod->disabled = 1;
        for (v = 0; v < mod->inc_size; v++) {
            mod->inc[v].submodule->disabled = 1;
        }
    }

    /* free the set */
    ly_set_free(mods);

    /* update the module-set-id */
    ctx->models.module_set_id++;

    return EXIT_SUCCESS;
}